

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ess_describe_scaling_rules.cc
# Opt level: O0

int __thiscall
aliyun::Ess::DescribeScalingRules
          (Ess *this,EssDescribeScalingRulesRequestType *req,
          EssDescribeScalingRulesResponseType *response,EssErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  AliRpcRequest *pAVar4;
  ulong uVar5;
  Value *pVVar6;
  bool local_e4a;
  allocator<char> local_e49;
  string local_e48;
  byte local_e22;
  allocator<char> local_e21;
  string local_e20;
  byte local_dfa;
  allocator<char> local_df9;
  string local_df8;
  byte local_dd2;
  allocator<char> local_dd1;
  string local_dd0;
  allocator<char> local_da9;
  string local_da8;
  allocator<char> local_d81;
  string local_d80;
  string local_d60;
  allocator<char> local_d39;
  string local_d38;
  string local_d18;
  allocator<char> local_cf1;
  string local_cf0;
  string local_cd0;
  allocator<char> local_ca9;
  string local_ca8;
  string local_c88;
  allocator<char> local_c61;
  string local_c60;
  string local_c40;
  allocator<char> local_c19;
  string local_c18;
  string local_bf8;
  allocator<char> local_bd1;
  string local_bd0;
  string local_bb0;
  allocator<char> local_b89;
  string local_b88;
  string local_b68;
  allocator<char> local_b41;
  string local_b40;
  string local_b20;
  allocator<char> local_af9;
  string local_af8;
  string local_ad8;
  allocator<char> local_ab1;
  string local_ab0;
  string local_a90;
  allocator<char> local_a69;
  string local_a68;
  string local_a48;
  allocator<char> local_a21;
  string local_a20;
  string local_a00;
  allocator<char> local_9d9;
  string local_9d8;
  string local_9b8;
  allocator<char> local_991;
  string local_990;
  string local_970;
  allocator<char> local_949;
  string local_948;
  string local_928;
  allocator<char> local_901;
  string local_900;
  string local_8e0;
  allocator<char> local_8b9;
  string local_8b8;
  string local_898;
  allocator<char> local_871;
  string local_870;
  string local_850;
  allocator<char> local_829;
  string local_828;
  string local_808;
  allocator<char> local_7e1;
  string local_7e0;
  string local_7c0;
  allocator<char> local_799;
  string local_798;
  string local_778;
  allocator<char> local_751;
  string local_750;
  string local_730;
  allocator<char> local_709;
  string local_708;
  string local_6e8;
  allocator<char> local_6c1;
  string local_6c0;
  string local_6a0;
  allocator<char> local_679;
  string local_678;
  string local_658;
  allocator<char> local_631;
  string local_630;
  string local_610;
  allocator<char> local_5e9;
  string local_5e8;
  string local_5c8;
  allocator<char> local_5a1;
  string local_5a0;
  string local_580;
  allocator<char> local_559;
  string local_558;
  string local_538;
  allocator<char> local_511;
  string local_510;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  string local_460;
  allocator<char> local_439;
  string local_438;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  string local_388;
  allocator<char> local_361;
  string local_360;
  string local_340;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  undefined1 local_2a8 [8];
  Reader reader;
  Value val;
  string local_178;
  undefined1 local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  AliRpcRequest *local_98;
  AliRpcRequest *req_rpc;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string secheme;
  int local_50;
  bool parse_success;
  int ret;
  int status_code;
  string str_response;
  EssErrorInfo *error_info_local;
  EssDescribeScalingRulesResponseType *response_local;
  EssDescribeScalingRulesRequestType *req_local;
  Ess *this_local;
  
  str_response.field_2._8_8_ = error_info;
  std::__cxx11::string::string((string *)&ret);
  secheme.field_2._M_local_buf[0xf] = '\0';
  pcVar3 = "http";
  if ((this->use_tls_ & 1U) != 0) {
    pcVar3 = "https";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,pcVar3,&local_79);
  std::allocator<char>::~allocator(&local_79);
  pAVar4 = (AliRpcRequest *)operator_new(0x2c8);
  local_151 = 1;
  pcVar3 = this->version_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pcVar3,&local_b9);
  pcVar3 = this->appid_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,pcVar3,&local_e1);
  pcVar3 = this->secret_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,pcVar3,&local_109);
  std::operator+(&local_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,"://"
                );
  std::operator+(&local_130,&local_150,this->host_);
  AliRpcRequest::AliRpcRequest(pAVar4,&local_b8,&local_e0,&local_108,&local_130);
  local_151 = 0;
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  local_98 = pAVar4;
  if ((((this->use_tls_ & 1U) == 0) && (this->proxy_host_ != (char *)0x0)) &&
     (*this->proxy_host_ != '\0')) {
    pcVar3 = this->proxy_host_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,pcVar3,(allocator<char> *)((long)&val.comments_ + 7));
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)pAVar4,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator((allocator<char> *)((long)&val.comments_ + 7));
  }
  Json::Value::Value((Value *)&reader.features_,nullValue);
  Json::Reader::Reader((Reader *)local_2a8);
  pAVar4 = local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"Action",&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"DescribeScalingRules",&local_2f1);
  AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_2c8,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"OwnerId",&local_319);
    std::__cxx11::string::string((string *)&local_340,(string *)req);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_318,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator(&local_319);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"ResourceOwnerAccount",&local_361);
    std::__cxx11::string::string((string *)&local_388,(string *)&req->resource_owner_account);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_360,&local_388);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_360);
    std::allocator<char>::~allocator(&local_361);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,"ResourceOwnerId",&local_3a9);
    std::__cxx11::string::string((string *)&local_3d0,(string *)&req->resource_owner_id);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_3a8,&local_3d0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::allocator<char>::~allocator(&local_3a9);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"PageNumber",&local_3f1)
    ;
    std::__cxx11::string::string((string *)&local_418,(string *)&req->page_number);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_3f0,&local_418);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator(&local_3f1);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"PageSize",&local_439);
    std::__cxx11::string::string((string *)&local_460,(string *)&req->page_size);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_438,&local_460);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_438);
    std::allocator<char>::~allocator(&local_439);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_480,"ScalingGroupId",&local_481);
    std::__cxx11::string::string((string *)&local_4a8,(string *)&req->scaling_group_id);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_480,&local_4a8);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_480);
    std::allocator<char>::~allocator(&local_481);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c8,"ScalingRuleId.1",&local_4c9);
    std::__cxx11::string::string((string *)&local_4f0,(string *)&req->scaling_rule_id1);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_4c8,&local_4f0);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::allocator<char>::~allocator(&local_4c9);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_510,"ScalingRuleId.2",&local_511);
    std::__cxx11::string::string((string *)&local_538,(string *)&req->scaling_rule_id2);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_510,&local_538);
    std::__cxx11::string::~string((string *)&local_538);
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator(&local_511);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_558,"ScalingRuleId.3",&local_559);
    std::__cxx11::string::string((string *)&local_580,(string *)&req->scaling_rule_id3);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_558,&local_580);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&local_558);
    std::allocator<char>::~allocator(&local_559);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5a0,"ScalingRuleId.4",&local_5a1);
    std::__cxx11::string::string((string *)&local_5c8,(string *)&req->scaling_rule_id4);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_5a0,&local_5c8);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::allocator<char>::~allocator(&local_5a1);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5e8,"ScalingRuleId.5",&local_5e9);
    std::__cxx11::string::string((string *)&local_610,(string *)&req->scaling_rule_id5);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_5e8,&local_610);
    std::__cxx11::string::~string((string *)&local_610);
    std::__cxx11::string::~string((string *)&local_5e8);
    std::allocator<char>::~allocator(&local_5e9);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_630,"ScalingRuleId.6",&local_631);
    std::__cxx11::string::string((string *)&local_658,(string *)&req->scaling_rule_id6);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_630,&local_658);
    std::__cxx11::string::~string((string *)&local_658);
    std::__cxx11::string::~string((string *)&local_630);
    std::allocator<char>::~allocator(&local_631);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_678,"ScalingRuleId.7",&local_679);
    std::__cxx11::string::string((string *)&local_6a0,(string *)&req->scaling_rule_id7);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_678,&local_6a0);
    std::__cxx11::string::~string((string *)&local_6a0);
    std::__cxx11::string::~string((string *)&local_678);
    std::allocator<char>::~allocator(&local_679);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6c0,"ScalingRuleId.8",&local_6c1);
    std::__cxx11::string::string((string *)&local_6e8,(string *)&req->scaling_rule_id8);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_6c0,&local_6e8);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::__cxx11::string::~string((string *)&local_6c0);
    std::allocator<char>::~allocator(&local_6c1);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_708,"ScalingRuleId.9",&local_709);
    std::__cxx11::string::string((string *)&local_730,(string *)&req->scaling_rule_id9);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_708,&local_730);
    std::__cxx11::string::~string((string *)&local_730);
    std::__cxx11::string::~string((string *)&local_708);
    std::allocator<char>::~allocator(&local_709);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_750,"ScalingRuleId.10",&local_751);
    std::__cxx11::string::string((string *)&local_778,(string *)&req->scaling_rule_id10);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_750,&local_778);
    std::__cxx11::string::~string((string *)&local_778);
    std::__cxx11::string::~string((string *)&local_750);
    std::allocator<char>::~allocator(&local_751);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_798,"ScalingRuleName.1",&local_799);
    std::__cxx11::string::string((string *)&local_7c0,(string *)&req->scaling_rule_name1);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_798,&local_7c0);
    std::__cxx11::string::~string((string *)&local_7c0);
    std::__cxx11::string::~string((string *)&local_798);
    std::allocator<char>::~allocator(&local_799);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7e0,"ScalingRuleName.2",&local_7e1);
    std::__cxx11::string::string((string *)&local_808,(string *)&req->scaling_rule_name2);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_7e0,&local_808);
    std::__cxx11::string::~string((string *)&local_808);
    std::__cxx11::string::~string((string *)&local_7e0);
    std::allocator<char>::~allocator(&local_7e1);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_828,"ScalingRuleName.3",&local_829);
    std::__cxx11::string::string((string *)&local_850,(string *)&req->scaling_rule_name3);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_828,&local_850);
    std::__cxx11::string::~string((string *)&local_850);
    std::__cxx11::string::~string((string *)&local_828);
    std::allocator<char>::~allocator(&local_829);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_870,"ScalingRuleName.4",&local_871);
    std::__cxx11::string::string((string *)&local_898,(string *)&req->scaling_rule_name4);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_870,&local_898);
    std::__cxx11::string::~string((string *)&local_898);
    std::__cxx11::string::~string((string *)&local_870);
    std::allocator<char>::~allocator(&local_871);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8b8,"ScalingRuleName.5",&local_8b9);
    std::__cxx11::string::string((string *)&local_8e0,(string *)&req->scaling_rule_name5);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_8b8,&local_8e0);
    std::__cxx11::string::~string((string *)&local_8e0);
    std::__cxx11::string::~string((string *)&local_8b8);
    std::allocator<char>::~allocator(&local_8b9);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_900,"ScalingRuleName.6",&local_901);
    std::__cxx11::string::string((string *)&local_928,(string *)&req->scaling_rule_name6);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_900,&local_928);
    std::__cxx11::string::~string((string *)&local_928);
    std::__cxx11::string::~string((string *)&local_900);
    std::allocator<char>::~allocator(&local_901);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_948,"ScalingRuleName.7",&local_949);
    std::__cxx11::string::string((string *)&local_970,(string *)&req->scaling_rule_name7);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_948,&local_970);
    std::__cxx11::string::~string((string *)&local_970);
    std::__cxx11::string::~string((string *)&local_948);
    std::allocator<char>::~allocator(&local_949);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_990,"ScalingRuleName.8",&local_991);
    std::__cxx11::string::string((string *)&local_9b8,(string *)&req->scaling_rule_name8);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_990,&local_9b8);
    std::__cxx11::string::~string((string *)&local_9b8);
    std::__cxx11::string::~string((string *)&local_990);
    std::allocator<char>::~allocator(&local_991);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9d8,"ScalingRuleName.9",&local_9d9);
    std::__cxx11::string::string((string *)&local_a00,(string *)&req->scaling_rule_name9);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_9d8,&local_a00);
    std::__cxx11::string::~string((string *)&local_a00);
    std::__cxx11::string::~string((string *)&local_9d8);
    std::allocator<char>::~allocator(&local_9d9);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a20,"ScalingRuleName.10",&local_a21);
    std::__cxx11::string::string((string *)&local_a48,(string *)&req->scaling_rule_name10);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_a20,&local_a48);
    std::__cxx11::string::~string((string *)&local_a48);
    std::__cxx11::string::~string((string *)&local_a20);
    std::allocator<char>::~allocator(&local_a21);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a68,"ScalingRuleAri.1",&local_a69);
    std::__cxx11::string::string((string *)&local_a90,(string *)&req->scaling_rule_ari1);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_a68,&local_a90);
    std::__cxx11::string::~string((string *)&local_a90);
    std::__cxx11::string::~string((string *)&local_a68);
    std::allocator<char>::~allocator(&local_a69);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ab0,"ScalingRuleAri.2",&local_ab1);
    std::__cxx11::string::string((string *)&local_ad8,(string *)&req->scaling_rule_ari2);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_ab0,&local_ad8);
    std::__cxx11::string::~string((string *)&local_ad8);
    std::__cxx11::string::~string((string *)&local_ab0);
    std::allocator<char>::~allocator(&local_ab1);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_af8,"ScalingRuleAri.3",&local_af9);
    std::__cxx11::string::string((string *)&local_b20,(string *)&req->scaling_rule_ari3);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_af8,&local_b20);
    std::__cxx11::string::~string((string *)&local_b20);
    std::__cxx11::string::~string((string *)&local_af8);
    std::allocator<char>::~allocator(&local_af9);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b40,"ScalingRuleAri.4",&local_b41);
    std::__cxx11::string::string((string *)&local_b68,(string *)&req->scaling_rule_ari4);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_b40,&local_b68);
    std::__cxx11::string::~string((string *)&local_b68);
    std::__cxx11::string::~string((string *)&local_b40);
    std::allocator<char>::~allocator(&local_b41);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b88,"ScalingRuleAri.5",&local_b89);
    std::__cxx11::string::string((string *)&local_bb0,(string *)&req->scaling_rule_ari5);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_b88,&local_bb0);
    std::__cxx11::string::~string((string *)&local_bb0);
    std::__cxx11::string::~string((string *)&local_b88);
    std::allocator<char>::~allocator(&local_b89);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bd0,"ScalingRuleAri.6",&local_bd1);
    std::__cxx11::string::string((string *)&local_bf8,(string *)&req->scaling_rule_ari6);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_bd0,&local_bf8);
    std::__cxx11::string::~string((string *)&local_bf8);
    std::__cxx11::string::~string((string *)&local_bd0);
    std::allocator<char>::~allocator(&local_bd1);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c18,"ScalingRuleAri.7",&local_c19);
    std::__cxx11::string::string((string *)&local_c40,(string *)&req->scaling_rule_ari7);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_c18,&local_c40);
    std::__cxx11::string::~string((string *)&local_c40);
    std::__cxx11::string::~string((string *)&local_c18);
    std::allocator<char>::~allocator(&local_c19);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c60,"ScalingRuleAri.8",&local_c61);
    std::__cxx11::string::string((string *)&local_c88,(string *)&req->scaling_rule_ari8);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_c60,&local_c88);
    std::__cxx11::string::~string((string *)&local_c88);
    std::__cxx11::string::~string((string *)&local_c60);
    std::allocator<char>::~allocator(&local_c61);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ca8,"ScalingRuleAri.9",&local_ca9);
    std::__cxx11::string::string((string *)&local_cd0,(string *)&req->scaling_rule_ari9);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_ca8,&local_cd0);
    std::__cxx11::string::~string((string *)&local_cd0);
    std::__cxx11::string::~string((string *)&local_ca8);
    std::allocator<char>::~allocator(&local_ca9);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cf0,"ScalingRuleAri.10",&local_cf1);
    std::__cxx11::string::string((string *)&local_d18,(string *)&req->scaling_rule_ari10);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_cf0,&local_d18);
    std::__cxx11::string::~string((string *)&local_d18);
    std::__cxx11::string::~string((string *)&local_cf0);
    std::allocator<char>::~allocator(&local_cf1);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d38,"OwnerAccount",&local_d39);
    std::__cxx11::string::string((string *)&local_d60,(string *)&req->owner_account);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_d38,&local_d60);
    std::__cxx11::string::~string((string *)&local_d60);
    std::__cxx11::string::~string((string *)&local_d38);
    std::allocator<char>::~allocator(&local_d39);
  }
  pAVar4 = local_98;
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d80,"RegionId",&local_d81);
    pcVar3 = this->region_id_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_da8,pcVar3,&local_da9);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_d80,&local_da8);
    std::__cxx11::string::~string((string *)&local_da8);
    std::allocator<char>::~allocator(&local_da9);
    std::__cxx11::string::~string((string *)&local_d80);
    std::allocator<char>::~allocator(&local_d81);
  }
  iVar2 = (**(local_98->super_AliHttpRequest)._vptr_AliHttpRequest)();
  if (iVar2 == 0) {
    local_50 = AliHttpRequest::WaitResponseHeaderComplete(&local_98->super_AliHttpRequest);
    AliHttpRequest::ReadResponseBody(&local_98->super_AliHttpRequest,(string *)&ret);
    if ((0 < local_50) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
      secheme.field_2._M_local_buf[0xf] =
           Json::Reader::parse((Reader *)local_2a8,(string *)&ret,(Value *)&reader.features_,true);
    }
    if ((secheme.field_2._M_local_buf[0xf] & 1U) == 0) {
      if (str_response.field_2._8_8_ != 0) {
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x20),"parse response failed");
      }
      local_50 = -1;
    }
    else {
      if (((local_50 != 200) && (str_response.field_2._8_8_ != 0)) &&
         ((secheme.field_2._M_local_buf[0xf] & 1U) != 0)) {
        local_dd2 = 0;
        bVar1 = Json::Value::isMember((Value *)&reader.features_,"RequestId");
        if (bVar1) {
          pVVar6 = Json::Value::operator[]((Value *)&reader.features_,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_dd0,pVVar6);
        }
        else {
          std::allocator<char>::allocator();
          local_dd2 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_dd0,anon_var_dwarf_e09dc + 9,&local_dd1);
        }
        std::__cxx11::string::operator=((string *)str_response.field_2._8_8_,(string *)&local_dd0);
        std::__cxx11::string::~string((string *)&local_dd0);
        if ((local_dd2 & 1) != 0) {
          std::allocator<char>::~allocator(&local_dd1);
        }
        local_dfa = 0;
        bVar1 = Json::Value::isMember((Value *)&reader.features_,"Code");
        if (bVar1) {
          pVVar6 = Json::Value::operator[]((Value *)&reader.features_,"Code");
          Json::Value::asString_abi_cxx11_(&local_df8,pVVar6);
        }
        else {
          std::allocator<char>::allocator();
          local_dfa = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_df8,anon_var_dwarf_e09dc + 9,&local_df9);
        }
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x20),(string *)&local_df8);
        std::__cxx11::string::~string((string *)&local_df8);
        if ((local_dfa & 1) != 0) {
          std::allocator<char>::~allocator(&local_df9);
        }
        local_e22 = 0;
        bVar1 = Json::Value::isMember((Value *)&reader.features_,"HostId");
        if (bVar1) {
          pVVar6 = Json::Value::operator[]((Value *)&reader.features_,"HostId");
          Json::Value::asString_abi_cxx11_(&local_e20,pVVar6);
        }
        else {
          std::allocator<char>::allocator();
          local_e22 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e20,anon_var_dwarf_e09dc + 9,&local_e21);
        }
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x60),(string *)&local_e20);
        std::__cxx11::string::~string((string *)&local_e20);
        if ((local_e22 & 1) != 0) {
          std::allocator<char>::~allocator(&local_e21);
        }
        local_e4a = Json::Value::isMember((Value *)&reader.features_,"Message");
        if (local_e4a) {
          pVVar6 = Json::Value::operator[]((Value *)&reader.features_,"Message");
          Json::Value::asString_abi_cxx11_(&local_e48,pVVar6);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e48,anon_var_dwarf_e09dc + 9,&local_e49);
        }
        local_e4a = !local_e4a;
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x40),(string *)&local_e48);
        std::__cxx11::string::~string((string *)&local_e48);
        if (local_e4a) {
          std::allocator<char>::~allocator(&local_e49);
        }
      }
      if ((local_50 == 200) && (response != (EssDescribeScalingRulesResponseType *)0x0)) {
        anon_unknown.dwarf_56139::Json2Type((Value *)&reader.features_,response);
      }
    }
  }
  else {
    if (str_response.field_2._8_8_ != 0) {
      std::__cxx11::string::operator=
                ((string *)(str_response.field_2._8_8_ + 0x20),"connect to host failed");
    }
    local_50 = -1;
  }
  pAVar4 = local_98;
  if (local_98 != (AliRpcRequest *)0x0) {
    AliRpcRequest::~AliRpcRequest(local_98);
    operator_delete(pAVar4,0x2c8);
  }
  Json::Reader::~Reader((Reader *)local_2a8);
  Json::Value::~Value((Value *)&reader.features_);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)&ret);
  return local_50;
}

Assistant:

int Ess::DescribeScalingRules(const EssDescribeScalingRulesRequestType& req,
                      EssDescribeScalingRulesResponseType* response,
                       EssErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeScalingRules");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.page_number.empty()) {
    req_rpc->AddRequestQuery("PageNumber", req.page_number);
  }
  if(!req.page_size.empty()) {
    req_rpc->AddRequestQuery("PageSize", req.page_size);
  }
  if(!req.scaling_group_id.empty()) {
    req_rpc->AddRequestQuery("ScalingGroupId", req.scaling_group_id);
  }
  if(!req.scaling_rule_id1.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.1", req.scaling_rule_id1);
  }
  if(!req.scaling_rule_id2.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.2", req.scaling_rule_id2);
  }
  if(!req.scaling_rule_id3.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.3", req.scaling_rule_id3);
  }
  if(!req.scaling_rule_id4.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.4", req.scaling_rule_id4);
  }
  if(!req.scaling_rule_id5.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.5", req.scaling_rule_id5);
  }
  if(!req.scaling_rule_id6.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.6", req.scaling_rule_id6);
  }
  if(!req.scaling_rule_id7.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.7", req.scaling_rule_id7);
  }
  if(!req.scaling_rule_id8.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.8", req.scaling_rule_id8);
  }
  if(!req.scaling_rule_id9.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.9", req.scaling_rule_id9);
  }
  if(!req.scaling_rule_id10.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.10", req.scaling_rule_id10);
  }
  if(!req.scaling_rule_name1.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.1", req.scaling_rule_name1);
  }
  if(!req.scaling_rule_name2.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.2", req.scaling_rule_name2);
  }
  if(!req.scaling_rule_name3.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.3", req.scaling_rule_name3);
  }
  if(!req.scaling_rule_name4.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.4", req.scaling_rule_name4);
  }
  if(!req.scaling_rule_name5.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.5", req.scaling_rule_name5);
  }
  if(!req.scaling_rule_name6.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.6", req.scaling_rule_name6);
  }
  if(!req.scaling_rule_name7.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.7", req.scaling_rule_name7);
  }
  if(!req.scaling_rule_name8.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.8", req.scaling_rule_name8);
  }
  if(!req.scaling_rule_name9.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.9", req.scaling_rule_name9);
  }
  if(!req.scaling_rule_name10.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.10", req.scaling_rule_name10);
  }
  if(!req.scaling_rule_ari1.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.1", req.scaling_rule_ari1);
  }
  if(!req.scaling_rule_ari2.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.2", req.scaling_rule_ari2);
  }
  if(!req.scaling_rule_ari3.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.3", req.scaling_rule_ari3);
  }
  if(!req.scaling_rule_ari4.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.4", req.scaling_rule_ari4);
  }
  if(!req.scaling_rule_ari5.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.5", req.scaling_rule_ari5);
  }
  if(!req.scaling_rule_ari6.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.6", req.scaling_rule_ari6);
  }
  if(!req.scaling_rule_ari7.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.7", req.scaling_rule_ari7);
  }
  if(!req.scaling_rule_ari8.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.8", req.scaling_rule_ari8);
  }
  if(!req.scaling_rule_ari9.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.9", req.scaling_rule_ari9);
  }
  if(!req.scaling_rule_ari10.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.10", req.scaling_rule_ari10);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}